

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O3

void lj_buf_shrink(lua_State *L,SBuf *sb)

{
  int iVar1;
  char *p;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  ulong nsz;
  
  p = sb->b;
  uVar4 = (long)sb->e - (long)p;
  uVar3 = (uint)uVar4;
  if (0x40 < uVar3) {
    iVar1 = *(int *)&sb->w;
    nsz = (ulong)(uVar3 >> 1);
    pcVar2 = (char *)lj_mem_realloc(L,p,uVar4 & 0xffffffff,nsz);
    sb->b = pcVar2;
    sb->w = pcVar2 + (uint)(iVar1 - (int)p);
    sb->e = pcVar2 + nsz;
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_buf_shrink(lua_State *L, SBuf *sb)
{
  char *b = sb->b;
  MSize osz = (MSize)(sb->e - b);
  if (osz > 2*LJ_MIN_SBUF) {
    MSize n = (MSize)(sb->w - b);
    b = lj_mem_realloc(L, b, osz, (osz >> 1));
    sb->b = b;
    sb->w = b + n;
    sb->e = b + (osz >> 1);
  }
  lj_assertG_(G(sbufL(sb)), !sbufisext(sb), "YAGNI shrink SBufExt");
}